

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1.c
# Opt level: O0

size_t ptls_asn1_validation_recursive
                 (uint8_t *bytes,size_t bytes_max,int *decode_error,int level,
                 ptls_minicrypto_log_ctx_t *log_ctx)

{
  size_t sVar1;
  int *local_58;
  size_t byte_index;
  size_t last_byte;
  uint32_t local_40;
  int indefinite_length;
  uint32_t length;
  uint32_t type_number;
  int type_class;
  int structure_bit;
  ptls_minicrypto_log_ctx_t *log_ctx_local;
  int *piStack_20;
  int level_local;
  int *decode_error_local;
  size_t bytes_max_local;
  uint8_t *bytes_local;
  
  type_number = 0;
  length = 0;
  indefinite_length = 0;
  local_40 = 0;
  last_byte._4_4_ = 0;
  byte_index = 0;
  _type_class = log_ctx;
  log_ctx_local._4_4_ = level;
  piStack_20 = decode_error;
  decode_error_local = (int *)bytes_max;
  bytes_max_local = (size_t)bytes;
  sVar1 = ptls_asn1_read_type(bytes,bytes_max,(int *)&type_number,(int *)&length,
                              (uint32_t *)&indefinite_length,decode_error,level,log_ctx);
  if ((*piStack_20 == 0) && (_type_class != (ptls_minicrypto_log_ctx_t *)0x0)) {
    ptls_asn1_print_type(length,indefinite_length,log_ctx_local._4_4_,_type_class);
  }
  local_58 = (int *)ptls_asn1_read_length
                              ((uint8_t *)bytes_max_local,(size_t)decode_error_local,sVar1,&local_40
                               ,(int *)((long)&last_byte + 4),&byte_index,piStack_20,
                               log_ctx_local._4_4_,_type_class);
  if (byte_index <= decode_error_local) {
    if (type_number == 0) {
      ptls_asn1_dump_content((uint8_t *)bytes_max_local,byte_index,(size_t)local_58,_type_class);
      local_58 = (int *)byte_index;
    }
    else {
      if (_type_class != (ptls_minicrypto_log_ctx_t *)0x0) {
        (*_type_class->fn)(_type_class->ctx," {\n");
      }
      while (local_58 < byte_index) {
        if ((last_byte._4_4_ != 0) && (*(char *)(bytes_max_local + (long)local_58) == '\0')) {
          if ((decode_error_local < (int *)((long)local_58 + 2U)) ||
             (*(char *)(bytes_max_local + 1 + (long)local_58) != '\0')) {
            ptls_asn1_error_message
                      ("EOC: unexpected end of content",(size_t)decode_error_local,(size_t)local_58,
                       log_ctx_local._4_4_ + 1,_type_class);
            *piStack_20 = 0x239;
            local_58 = decode_error_local;
          }
          else {
            if (_type_class != (ptls_minicrypto_log_ctx_t *)0x0) {
              ptls_asn1_print_indent(log_ctx_local._4_4_,_type_class);
              (*_type_class->fn)(_type_class->ctx,"EOC\n");
            }
            local_58 = (int *)((long)local_58 + 2);
          }
          break;
        }
        sVar1 = ptls_asn1_validation_recursive
                          ((uint8_t *)(bytes_max_local + (long)local_58),byte_index - (long)local_58
                           ,piStack_20,log_ctx_local._4_4_ + 1,_type_class);
        local_58 = (int *)(sVar1 + (long)local_58);
        if (*piStack_20 != 0) {
          local_58 = decode_error_local;
          break;
        }
        if (_type_class != (ptls_minicrypto_log_ctx_t *)0x0) {
          if (local_58 < byte_index) {
            (*_type_class->fn)(_type_class->ctx,",");
          }
          (*_type_class->fn)(_type_class->ctx,"\n");
        }
      }
      if (_type_class != (ptls_minicrypto_log_ctx_t *)0x0) {
        ptls_asn1_print_indent(log_ctx_local._4_4_,_type_class);
        (*_type_class->fn)(_type_class->ctx,"}");
      }
    }
  }
  return (size_t)local_58;
}

Assistant:

size_t ptls_asn1_validation_recursive(const uint8_t *bytes, size_t bytes_max, int *decode_error, int level,
                                      ptls_minicrypto_log_ctx_t *log_ctx)
{
    /* Get the type byte */
    int structure_bit = 0;
    int type_class = 0;
    uint32_t type_number = 0;
    uint32_t length = 0;
    int indefinite_length = 0;
    size_t last_byte = 0;
    /* Decode the type */
    size_t byte_index =
        ptls_asn1_read_type(bytes, bytes_max, &structure_bit, &type_class, &type_number, decode_error, level, log_ctx);

    if (*decode_error == 0 && log_ctx != NULL) {
        ptls_asn1_print_type(type_class, type_number, level, log_ctx);
    }

    /* Get the length */
    byte_index =
        ptls_asn1_read_length(bytes, bytes_max, byte_index, &length, &indefinite_length, &last_byte, decode_error, level, log_ctx);

    if (last_byte <= bytes_max) {
        if (structure_bit) {
            /* If structured, recurse on a loop */
            if (log_ctx != NULL) {
                log_ctx->fn(log_ctx->ctx, " {\n");
            }

            while (byte_index < last_byte) {
                if (indefinite_length != 0 && bytes[byte_index] == 0) {
                    if (byte_index + 2 > bytes_max || bytes[byte_index + 1] != 0) {
                        byte_index =
                            ptls_asn1_error_message("EOC: unexpected end of content", bytes_max, byte_index, level + 1, log_ctx);

                        *decode_error = PTLS_ERROR_BER_UNEXPECTED_EOC;
                        byte_index = bytes_max;
                        break;
                    } else {
                        if (log_ctx != NULL) {
                            ptls_asn1_print_indent(level, log_ctx);
                            log_ctx->fn(log_ctx->ctx, "EOC\n");
                        }
                        byte_index += 2;
                        break;
                    }
                } else {
                    byte_index += ptls_asn1_validation_recursive(bytes + byte_index, last_byte - byte_index, decode_error,
                                                                 level + 1, log_ctx);

                    if (*decode_error) {
                        byte_index = bytes_max;
                        break;
                    }
                }

                if (log_ctx != NULL) {
                    if (byte_index < last_byte) {
                        log_ctx->fn(log_ctx->ctx, ",");
                    }
                    log_ctx->fn(log_ctx->ctx, "\n");
                }
            }

            if (log_ctx != NULL) {
                ptls_asn1_print_indent(level, log_ctx);
                log_ctx->fn(log_ctx->ctx, "}");
            }
        } else {
            ptls_asn1_dump_content(bytes, last_byte, byte_index, log_ctx);
            byte_index = last_byte;
        }
    }

    return byte_index;
}